

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

void N_VScale_Serial(sunrealtype c,N_Vector x,N_Vector z)

{
  long lVar1;
  long lVar2;
  sunrealtype *xd;
  sunrealtype *zd;
  long lVar3;
  long lVar4;
  
  if (z == x) {
    lVar2 = *x->content;
    lVar1 = *(long *)((long)x->content + 0x10);
    lVar3 = 0;
    if (lVar2 < 1) {
      lVar2 = lVar3;
    }
    for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      *(double *)(lVar1 + lVar3 * 8) = *(double *)(lVar1 + lVar3 * 8) * c;
    }
  }
  else if ((c != 1.0) || (NAN(c))) {
    lVar2 = *x->content;
    lVar1 = *(long *)((long)x->content + 0x10);
    lVar3 = *(long *)((long)z->content + 0x10);
    if ((c != -1.0) || (NAN(c))) {
      lVar4 = 0;
      if (lVar2 < 1) {
        lVar2 = lVar4;
      }
      for (; lVar2 != lVar4; lVar4 = lVar4 + 1) {
        *(double *)(lVar3 + lVar4 * 8) = *(double *)(lVar1 + lVar4 * 8) * c;
      }
    }
    else {
      lVar4 = 0;
      if (lVar2 < 1) {
        lVar2 = lVar4;
      }
      for (; lVar2 != lVar4; lVar4 = lVar4 + 1) {
        *(ulong *)(lVar3 + lVar4 * 8) = *(ulong *)(lVar1 + lVar4 * 8) ^ 0x8000000000000000;
      }
    }
  }
  else {
    lVar2 = *x->content;
    lVar1 = *(long *)((long)x->content + 0x10);
    lVar3 = *(long *)((long)z->content + 0x10);
    lVar4 = 0;
    if (lVar2 < 1) {
      lVar2 = lVar4;
    }
    for (; lVar2 != lVar4; lVar4 = lVar4 + 1) {
      *(undefined8 *)(lVar3 + lVar4 * 8) = *(undefined8 *)(lVar1 + lVar4 * 8);
    }
  }
  return;
}

Assistant:

void N_VScale_Serial(sunrealtype c, N_Vector x, N_Vector z)
{
  sunindextype i, N;
  sunrealtype *xd, *zd;

  xd = zd = NULL;

  if (z == x)
  { /* BLAS usage: scale x <- cx */
    VScaleBy_Serial(c, x);
    return;
  }

  if (c == ONE) { VCopy_Serial(x, z); }
  else if (c == -ONE) { VNeg_Serial(x, z); }
  else
  {
    N  = NV_LENGTH_S(x);
    xd = NV_DATA_S(x);
    zd = NV_DATA_S(z);
    for (i = 0; i < N; i++) { zd[i] = c * xd[i]; }
  }

  return;
}